

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::IRContext::ProcessCallTreeFromRoots
          (IRContext *this,ProcessFunction *pfn,
          queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *roots)

{
  byte bVar1;
  bool bVar2;
  reference pvVar3;
  Function *__args;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar4;
  byte local_9a;
  Function *fn;
  value_type local_64;
  undefined1 local_60 [4];
  uint32_t fi;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  done;
  bool modified;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *roots_local;
  ProcessFunction *pfn_local;
  IRContext *this_local;
  
  done._M_h._M_single_bucket._7_1_ = 0;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_60);
  while( true ) {
    do {
      bVar2 = std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
              empty(roots);
      bVar1 = done._M_h._M_single_bucket._7_1_;
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_60);
        return (bool)(bVar1 & 1);
      }
      pvVar3 = std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
               front(roots);
      local_64 = *pvVar3;
      std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop(roots)
      ;
      pVar4 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)local_60,&local_64);
    } while (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
    __args = GetFunction(this,local_64);
    if (__args == (Function *)0x0) break;
    bVar2 = std::function<bool_(spvtools::opt::Function_*)>::operator()(pfn,__args);
    local_9a = 1;
    if (!bVar2) {
      local_9a = done._M_h._M_single_bucket._7_1_;
    }
    done._M_h._M_single_bucket._7_1_ = local_9a & 1;
    AddCalls(this,__args,roots);
  }
  __assert_fail("fn && \"Trying to process a function that does not exist.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp"
                ,0x3d8,
                "bool spvtools::opt::IRContext::ProcessCallTreeFromRoots(ProcessFunction &, std::queue<uint32_t> *)"
               );
}

Assistant:

bool IRContext::ProcessCallTreeFromRoots(ProcessFunction& pfn,
                                         std::queue<uint32_t>* roots) {
  // Process call tree
  bool modified = false;
  std::unordered_set<uint32_t> done;

  while (!roots->empty()) {
    const uint32_t fi = roots->front();
    roots->pop();
    if (done.insert(fi).second) {
      Function* fn = GetFunction(fi);
      assert(fn && "Trying to process a function that does not exist.");
      modified = pfn(fn) || modified;
      AddCalls(fn, roots);
    }
  }
  return modified;
}